

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

char16_t * __thiscall
icu_63::MaybeStackArray<char16_t,_40>::orphanOrClone
          (MaybeStackArray<char16_t,_40> *this,int32_t length,int32_t *resultCapacity)

{
  char16_t *local_30;
  char16_t *p;
  int32_t *resultCapacity_local;
  int32_t length_local;
  MaybeStackArray<char16_t,_40> *this_local;
  
  resultCapacity_local._4_4_ = length;
  if (this->needToRelease == '\0') {
    if (length < 1) {
      return (char16_t *)0x0;
    }
    if (this->capacity < length) {
      resultCapacity_local._4_4_ = this->capacity;
    }
    local_30 = (char16_t *)uprv_malloc_63((long)resultCapacity_local._4_4_ << 1);
    if (local_30 == (char16_t *)0x0) {
      return (char16_t *)0x0;
    }
    memcpy(local_30,this->ptr,(long)resultCapacity_local._4_4_ << 1);
  }
  else {
    local_30 = this->ptr;
  }
  *resultCapacity = resultCapacity_local._4_4_;
  resetToStackArray(this);
  return local_30;
}

Assistant:

inline T *MaybeStackArray<T, stackCapacity>::orphanOrClone(int32_t length, int32_t &resultCapacity) {
    T *p;
    if(needToRelease) {
        p=ptr;
    } else if(length<=0) {
        return NULL;
    } else {
        if(length>capacity) {
            length=capacity;
        }
        p=(T *)uprv_malloc(length*sizeof(T));
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStacArray (orphan) alloc %d * %lu\n", length,sizeof(T));
#endif
        if(p==NULL) {
            return NULL;
        }
        uprv_memcpy(p, ptr, (size_t)length*sizeof(T));
    }
    resultCapacity=length;
    resetToStackArray();
    return p;
}